

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O1

bool __thiscall kratos::IRNode::has_attribute(IRNode *this,string *value_str)

{
  bool bVar1;
  __normal_iterator<const_std::shared_ptr<kratos::Attribute>_*,_std::vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>_>
  __it;
  __normal_iterator<const_std::shared_ptr<kratos::Attribute>_*,_std::vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>_>
  __it_00;
  long lVar2;
  shared_ptr<kratos::Attribute> *psVar3;
  __normal_iterator<const_std::shared_ptr<kratos::Attribute>_*,_std::vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>_>
  _Var4;
  string *local_40;
  shared_ptr<kratos::Attribute> *local_38;
  
  __it._M_current =
       (this->attributes_).
       super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (this->attributes_).
           super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar2 = (long)psVar3 - (long)__it._M_current >> 6;
  __it_00._M_current = __it._M_current;
  local_40 = value_str;
  if (0 < lVar2) {
    __it_00._M_current =
         (shared_ptr<kratos::Attribute> *)
         ((long)&((__it._M_current)->
                 super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
         ((long)psVar3 - (long)__it._M_current & 0xffffffffffffffc0U));
    lVar2 = lVar2 + 1;
    local_38 = psVar3;
    do {
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<kratos::IRNode::has_attribute(std::__cxx11::string_const&)const::$_0>::
              operator()((_Iter_pred<kratos::IRNode::has_attribute(std::__cxx11::string_const&)const::__0>
                          *)&local_40,__it);
      psVar3 = local_38;
      _Var4._M_current = __it._M_current;
      if (bVar1) goto LAB_001c10f8;
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<kratos::IRNode::has_attribute(std::__cxx11::string_const&)const::$_0>::
              operator()((_Iter_pred<kratos::IRNode::has_attribute(std::__cxx11::string_const&)const::__0>
                          *)&local_40,__it._M_current + 1);
      psVar3 = local_38;
      _Var4._M_current = __it._M_current + 1;
      if (bVar1) goto LAB_001c10f8;
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<kratos::IRNode::has_attribute(std::__cxx11::string_const&)const::$_0>::
              operator()((_Iter_pred<kratos::IRNode::has_attribute(std::__cxx11::string_const&)const::__0>
                          *)&local_40,__it._M_current + 2);
      psVar3 = local_38;
      _Var4._M_current = __it._M_current + 2;
      if (bVar1) goto LAB_001c10f8;
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<kratos::IRNode::has_attribute(std::__cxx11::string_const&)const::$_0>::
              operator()((_Iter_pred<kratos::IRNode::has_attribute(std::__cxx11::string_const&)const::__0>
                          *)&local_40,__it._M_current + 3);
      psVar3 = local_38;
      _Var4._M_current = __it._M_current + 3;
      if (bVar1) goto LAB_001c10f8;
      __it._M_current = __it._M_current + 4;
      lVar2 = lVar2 + -1;
    } while (1 < lVar2);
  }
  lVar2 = (long)psVar3 - (long)__it_00._M_current >> 4;
  if (lVar2 != 1) {
    if (lVar2 != 2) {
      _Var4._M_current = psVar3;
      if ((lVar2 != 3) ||
         (bVar1 = __gnu_cxx::__ops::
                  _Iter_pred<kratos::IRNode::has_attribute(std::__cxx11::string_const&)const::$_0>::
                  operator()((_Iter_pred<kratos::IRNode::has_attribute(std::__cxx11::string_const&)const::__0>
                              *)&local_40,__it_00), _Var4._M_current = __it_00._M_current, bVar1))
      goto LAB_001c10f8;
      __it_00._M_current = __it_00._M_current + 1;
    }
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<kratos::IRNode::has_attribute(std::__cxx11::string_const&)const::$_0>::
            operator()((_Iter_pred<kratos::IRNode::has_attribute(std::__cxx11::string_const&)const::__0>
                        *)&local_40,__it_00);
    _Var4._M_current = __it_00._M_current;
    if (bVar1) goto LAB_001c10f8;
    __it_00._M_current = __it_00._M_current + 1;
  }
  bVar1 = __gnu_cxx::__ops::
          _Iter_pred<kratos::IRNode::has_attribute(std::__cxx11::string_const&)const::$_0>::
          operator()((_Iter_pred<kratos::IRNode::has_attribute(std::__cxx11::string_const&)const::__0>
                      *)&local_40,__it_00);
  _Var4._M_current = __it_00._M_current;
  if (!bVar1) {
    _Var4._M_current = psVar3;
  }
LAB_001c10f8:
  return _Var4._M_current != psVar3;
}

Assistant:

bool IRNode::has_attribute(const std::string &value_str) const {
    return std::any_of(attributes_.begin(), attributes_.end(),
                       [&](auto const &attr) { return attr->value_str == value_str; });
}